

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O2

void __thiscall
UdpReceiver::Loop(UdpReceiver *this,_func_void_char_ptr_int_void_ptr *udpCallback,void *data)

{
  ssize_t sVar1;
  hostent *phVar2;
  char *pcVar3;
  
  memset(this->buffer,0,(long)this->bufferSize);
  sVar1 = recvfrom(this->socketFile,this->buffer,(long)this->bufferSize,0,
                   (sockaddr *)&this->clientAddress,&this->clientLength);
  if ((int)sVar1 < 0) {
    error("ERROR: There was a problem receiving data from a client");
  }
  phVar2 = gethostbyaddr(&(this->clientAddress).sin_addr,4,2);
  this->client = (hostent *)phVar2;
  if (phVar2 != (hostent *)0x0) {
    pcVar3 = inet_ntoa((in_addr)(this->clientAddress).sin_addr.s_addr);
    this->clientIP = pcVar3;
    if (pcVar3 != (char *)0x0) {
      (*udpCallback)(this->buffer,(int)sVar1,data);
      return;
    }
    error("ERROR: Error getting client IP.");
  }
  error("ERROR: Error getting client host info");
}

Assistant:

void Loop(void (*udpCallback)(char* packet, int packetSize, void* data), void* data) {
      int packetSize;
      bzero(this->buffer, this->bufferSize*sizeof(char));
      packetSize = recvfrom(  this->socketFile,
                              this->buffer,
                              this->bufferSize,
                              0,
                              (struct sockaddr *)&this->clientAddress,
                              &this->clientLength);
      if(packetSize < 0)
        error("ERROR: There was a problem receiving data from a client");
      this->client = gethostbyaddr( (const char*)&this->clientAddress.sin_addr.s_addr,
                                    sizeof(this->clientAddress.sin_addr.s_addr),
                                    AF_INET);
      if(this->client == NULL)
        error("ERROR: Error getting client host info");
      this->clientIP = inet_ntoa(this->clientAddress.sin_addr);
      if(this->clientIP == NULL)
        error("ERROR: Error getting client IP.");
      // ----------------------------- //
      // --- Some old info logging --- //
      // ----------------------------- //
      /*
      printf("Received datagram from %s (%s):\n",
              this->client->h_name,
              this->clientIP);
      for(int i=0; i<strlen(this->buffer)&&i<this->bufferSize; i++)
        printf("%c", this->buffer[i]);
      printf("\n");
      */
      udpCallback(this->buffer, packetSize, data);
    }